

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_longnames.cpp
# Opt level: O3

LongNameHandler *
icu_63::number::impl::LongNameHandler::forMeasureUnit
          (Locale *loc,MeasureUnit *unitRef,MeasureUnit *perUnit,UNumberUnitWidth *width,
          PluralRules *rules,MicroPropsGenerator *parent,UErrorCode *status)

{
  int iVar1;
  char *__s1;
  LongNameHandler *this;
  long lVar2;
  char *other;
  bool isResolved;
  MeasureUnit unit;
  MeasureUnit resolved;
  bool local_251;
  MeasureUnit local_250;
  UnicodeString local_238 [8];
  
  MeasureUnit::MeasureUnit(&local_250,unitRef);
  __s1 = MeasureUnit::getType(perUnit);
  other = "none";
  iVar1 = strcmp(__s1,"none");
  if (iVar1 != 0) {
    local_251 = false;
    MeasureUnit::resolveUnitPerUnit((MeasureUnit *)local_238,&local_250,perUnit,&local_251);
    if (local_251 != true) {
      this = forCompoundUnit(loc,&local_250,perUnit,width,rules,parent,status);
      MeasureUnit::~MeasureUnit((MeasureUnit *)local_238);
      goto LAB_00270957;
    }
    other = (char *)local_238;
    MeasureUnit::operator=(&local_250,(MeasureUnit *)other);
    MeasureUnit::~MeasureUnit((MeasureUnit *)local_238);
  }
  this = (LongNameHandler *)UMemory::operator_new((UMemory *)0x2c0,(size_t)other);
  if (this == (LongNameHandler *)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
    this = (LongNameHandler *)0x0;
  }
  else {
    LongNameHandler(this,rules,parent);
    lVar2 = 0;
    do {
      *(undefined ***)((long)&local_238[0].super_Replaceable.super_UObject._vptr_UObject + lVar2) =
           &PTR__UnicodeString_003febe0;
      *(undefined2 *)((long)&local_238[0].fUnion + lVar2) = 2;
      lVar2 = lVar2 + 0x40;
    } while (lVar2 != 0x200);
    anon_unknown.dwarf_19756d::getMeasureData(loc,&local_250,width,local_238,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      simpleFormatsToModifiers(this,local_238,UNUM_FIELD_COUNT,status);
    }
    lVar2 = 0x1c0;
    do {
      UnicodeString::~UnicodeString
                ((UnicodeString *)
                 ((long)&local_238[0].super_Replaceable.super_UObject._vptr_UObject + lVar2));
      lVar2 = lVar2 + -0x40;
    } while (lVar2 != -0x40);
  }
LAB_00270957:
  MeasureUnit::~MeasureUnit(&local_250);
  return this;
}

Assistant:

LongNameHandler*
LongNameHandler::forMeasureUnit(const Locale &loc, const MeasureUnit &unitRef, const MeasureUnit &perUnit,
                                const UNumberUnitWidth &width, const PluralRules *rules,
                                const MicroPropsGenerator *parent, UErrorCode &status) {
    MeasureUnit unit = unitRef;
    if (uprv_strcmp(perUnit.getType(), "none") != 0) {
        // Compound unit: first try to simplify (e.g., meters per second is its own unit).
        bool isResolved = false;
        MeasureUnit resolved = MeasureUnit::resolveUnitPerUnit(unit, perUnit, &isResolved);
        if (isResolved) {
            unit = resolved;
        } else {
            // No simplified form is available.
            return forCompoundUnit(loc, unit, perUnit, width, rules, parent, status);
        }
    }

    auto* result = new LongNameHandler(rules, parent);
    if (result == nullptr) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return nullptr;
    }
    UnicodeString simpleFormats[ARRAY_LENGTH];
    getMeasureData(loc, unit, width, simpleFormats, status);
    if (U_FAILURE(status)) { return result; }
    // TODO: What field to use for units?
    result->simpleFormatsToModifiers(simpleFormats, UNUM_FIELD_COUNT, status);
    return result;
}